

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O2

void __thiscall QColumnViewPrivate::disconnectView(QColumnViewPrivate *this,QAbstractItemView *view)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  Connection *pCVar4;
  ulong uVar5;
  Connection *connection;
  Connection *pCVar6;
  long in_FS_OFFSET;
  iterator it;
  QAbstractItemView *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = view;
  it = QHash<QAbstractItemView*,std::vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>>>
       ::findImpl<QAbstractItemView*>
                 ((QHash<QAbstractItemView*,std::vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>>>
                   *)&this->viewConnections,&local_38);
  if (it.i.d != (Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
                 *)0x0 || it.i.bucket != 0) {
    pSVar2 = (it.i.d)->spans;
    uVar5 = it.i.bucket >> 7;
    pEVar3 = pSVar2[uVar5].entries;
    bVar1 = pSVar2[uVar5].offsets[(uint)it.i.bucket & 0x7f];
    pCVar4 = *(Connection **)(pEVar3[bVar1].storage.data + 0x10);
    for (pCVar6 = *(Connection **)(pEVar3[bVar1].storage.data + 8); pCVar6 != pCVar4;
        pCVar6 = pCVar6 + 1) {
      QObject::disconnect(pCVar6);
    }
    QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
    ::erase(&this->viewConnections,(const_iterator)it.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnViewPrivate::disconnectView(QAbstractItemView *view)
{
    const auto it = viewConnections.find(view);
    if (it == viewConnections.end())
        return;
    for (const QMetaObject::Connection &connection : it.value())
        QObject::disconnect(connection);
    viewConnections.erase(it);
}